

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_module * ly_ctx_get_disabled_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  ushort uVar1;
  ulong uVar2;
  lys_module *plVar3;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    plVar3 = (lys_module *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "ly_ctx_get_disabled_module_iter");
  }
  else {
    uVar2 = (ulong)*idx;
    do {
      if ((uint)(ctx->models).used <= (uint)uVar2) {
        return (lys_module *)0x0;
      }
      plVar3 = (ctx->models).list[uVar2];
      uVar1 = *(ushort *)&plVar3->field_0x40;
      uVar2 = uVar2 + 1;
      *idx = (uint32_t)uVar2;
    } while ((uVar1 & 0x40) == 0);
  }
  return plVar3;
}

Assistant:

lys_module *
ly_ctx_get_disabled_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        LOGARG;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}